

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceSurface::~IfcFaceSurface(IfcFaceSurface *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  
  *(undefined ***)((long)&this[-1].SameSense.field_2 + 8) = &PTR__IfcFaceSurface_00871a08;
  (this->SameSense)._M_dataplus._M_p = (pointer)&PTR__IfcFaceSurface_00871aa8;
  *(undefined ***)&this[-1].field_0x88 = &PTR__IfcFaceSurface_00871a30;
  (this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFaceSurface_00871a58;
  *(undefined ***)&(this->super_IfcFace).super_IfcTopologicalRepresentationItem.field_0x28 =
       &PTR__IfcFaceSurface_00871a80;
  puVar2 = *(undefined1 **)&(this->super_IfcFace).field_0x40;
  puVar1 = &(this->super_IfcFace).field_0x50;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)((long)&this[-1].SameSense.field_2 + 8) = 0x871b80;
  (this->SameSense)._M_dataplus._M_p = (pointer)0x871bf8;
  *(undefined8 *)&this[-1].field_0x88 = 0x871ba8;
  (this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x871bd0;
  pvVar3 = *(void **)&(this->super_IfcFace).super_IfcTopologicalRepresentationItem.
                      super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x10;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&(this->super_IfcFace).super_IfcTopologicalRepresentationItem.
                                     super_IfcRepresentationItem.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     .field_0x20 - (long)pvVar3);
  }
  operator_delete((void *)((long)&this[-1].SameSense.field_2 + 8),0x98);
  return;
}

Assistant:

IfcFaceSurface() : Object("IfcFaceSurface") {}